

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableP<deqp::gls::BuiltinPrecisionTests::Void>::VariableP
          (VariableP<deqp::gls::BuiltinPrecisionTests::Void> *this,
          Variable<deqp::gls::BuiltinPrecisionTests::Void> *ptr)

{
  SharedPtrStateBase *pSVar1;
  
  (this->
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ).m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  (this->
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ).m_state = (SharedPtrStateBase *)0x0;
  (this->
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ).m_ptr = ptr;
  pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar1->strongRefCount = 0;
  pSVar1->weakRefCount = 0;
  pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b5a438;
  pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)ptr;
  (this->
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ).m_state = pSVar1;
  pSVar1->strongRefCount = 1;
  pSVar1->weakRefCount = 1;
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}